

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O2

void Qentem::Test::TestSuperVariableTag1(QTest *test)

{
  Value<char> *pVVar1;
  StringStream<char> *pSVar2;
  StringStream<char> ss;
  Value<char> value;
  
  ss.storage_ = (char *)0x0;
  ss.length_ = 0;
  ss.capacity_ = 0;
  value.field_0.array_.storage_ = (Value<char> *)0x0;
  value.field_0._8_8_ = 0;
  value.type_ = Undefined;
  pVVar1 = Value<char>::operator[](&value,"a");
  Value<char>::operator=(pVVar1,"a");
  pVVar1 = Value<char>::operator[](&value,"b");
  Value<char>::operator=(pVVar1,"bb");
  pVVar1 = Value<char>::operator[](&value,"c");
  Value<char>::operator=(pVVar1,"ccc");
  pVVar1 = Value<char>::operator[](&value,"d");
  Value<char>::operator=(pVVar1,"dddd");
  pVVar1 = Value<char>::operator[](&value,"4");
  Value<char>::operator=(pVVar1,"e");
  pVVar1 = Value<char>::operator[](&value,"e");
  Value<char>::operator=(pVVar1,"f");
  pVVar1 = Value<char>::operator[](&value,"ffffff");
  Value<char>::operator=(pVVar1,"g");
  pVVar1 = Value<char>::operator[](&value,"g");
  Value<char>::operator=(pVVar1,10);
  pVVar1 = Value<char>::operator[](&value,"h");
  Value<char>::reset(pVVar1);
  pVVar1->type_ = True;
  pVVar1 = Value<char>::operator[](&value,"999999999");
  Value<char>::operator=(pVVar1,"8000000000007779999999");
  pVVar1 = Value<char>::operator[](&value,"x_y_z");
  Value<char>::operator=(pVVar1,"the value is {0}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {var:a}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[15]>
            (test,pSVar2,(char (*) [15])"the value is a",0x8cc);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("..{svar:x_y_z, {var:d}}--",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[22]>
            (test,pSVar2,(char (*) [22])"..the value is dddd--",0x8cf);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     (".{svar:x_y_z, {var:g}}-",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[18]>
            (test,pSVar2,(char (*) [18])".the value is 10-",0x8d2);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     (".{svar:x_y_z, {var:h}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[19]>
            (test,pSVar2,(char (*) [19])".the value is true",0x8d5);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {var:999999999}}x",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[37]>
            (test,pSVar2,(char (*) [37])"the value is 8000000000007779999999x",0x8d9);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pVVar1 = Value<char>::operator[](&value,"x_y_z");
  Value<char>::operator=(pVVar1,"{0}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {var:4}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[2]>(test,pSVar2,(char (*) [2])0x1215d0,0x8de);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pVVar1 = Value<char>::operator[](&value,"x_y_z");
  Value<char>::operator=(pVVar1,"{0}{0} {0} {0}{0}{0}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {var:ffffff}}",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,pSVar2,(char (*) [9])"gg g ggg",0x8e3);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pVVar1 = Value<char>::operator[](&value,"x_y_z");
  Value<char>::operator=(pVVar1,"{0},{1}.{2}-{3}**{4}////{5}=={6} {7} {8} {9}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}}"
                      ,&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[56]>
            (test,pSVar2,(char (*) [56])"g,a.e-8000000000007779999999**10////true==ccc dddd bb f",
             0x8ec);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pVVar1 = Value<char>::operator[](&value,"a");
  Value<char>::operator=(pVVar1,"\'a");
  pVVar1 = Value<char>::operator[](&value,"b");
  Value<char>::operator=(pVVar1,"<>bb");
  pVVar1 = Value<char>::operator[](&value,"x_y_z");
  Value<char>::operator=(pVVar1,"{0},{1}.{2}-{3}**{4}////{5}=={6} {7} {8} {9}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}}"
                      ,&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[70]>
            (test,pSVar2,
             (char (*) [70])"g,&apos;a.e-8000000000007779999999**10////true==ccc dddd &lt;&gt;bb f",
             0x8f9);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {raw:ffffff}, {raw:a}, {raw:4}, {raw:999999999}, {raw:g}, {raw:h}, {raw:c}, {raw:d}, {raw:b}, {raw:e}}"
                      ,&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[59]>
            (test,pSVar2,
             (char (*) [59])"g,\'a.e-8000000000007779999999**10////true==ccc dddd <>bb f",0x908);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pVVar1 = Value<char>::operator[](&value,"a");
  Value<char>::operator=(pVVar1,10);
  pVVar1 = Value<char>::operator[](&value,"b");
  Value<char>::operator=(pVVar1,5);
  pVVar1 = Value<char>::operator[](&value,"c");
  Value<char>::operator=(pVVar1,3);
  pVVar1 = Value<char>::operator[](&value,"x_y_z");
  Value<char>::operator=(pVVar1,"{0} {1} {2} {3} {4}");
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{svar:x_y_z, {math:{var:a}+{var:b}+{var:c}},\n    {math:{var:a}*{var:b}*{var:c}},\n    {math:{var:a}-{var:b}-{var:c}},\n    {math:{var:a}+{var:b}-{var:c}},\n    {math:{var:a}/{var:b}+{var:c}}}"
                      ,&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,pSVar2,(char (*) [14])"18 150 2 12 5",0x917);
  Value<char>::~Value(&value);
  Memory::Deallocate(ss.storage_);
  return;
}

Assistant:

static void TestSuperVariableTag1(QTest &test) {
    StringStream<char> ss;
    Value<char>        value;

    value[R"(a)"]         = R"(a)";
    value[R"(b)"]         = R"(bb)";
    value[R"(c)"]         = R"(ccc)";
    value[R"(d)"]         = R"(dddd)";
    value[R"(4)"]         = R"(e)";
    value[R"(e)"]         = R"(f)";
    value[R"(ffffff)"]    = R"(g)";
    value[R"(g)"]         = 10;
    value[R"(h)"]         = true;
    value[R"(999999999)"] = R"(8000000000007779999999)";

    value[R"(x_y_z)"] = R"(the value is {0})";

    test.IsEqual(Template::Render(R"({svar:x_y_z, {var:a}})", value, ss), R"(the value is a)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"(..{svar:x_y_z, {var:d}}--)", value, ss), R"(..the value is dddd--)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"(.{svar:x_y_z, {var:g}}-)", value, ss), R"(.the value is 10-)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"(.{svar:x_y_z, {var:h}})", value, ss), R"(.the value is true)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"({svar:x_y_z, {var:999999999}}x)", value, ss),
                 R"(the value is 8000000000007779999999x)", __LINE__);
    ss.Clear();

    value[R"(x_y_z)"] = R"({0})";

    test.IsEqual(Template::Render(R"({svar:x_y_z, {var:4}})", value, ss), R"(e)", __LINE__);
    ss.Clear();

    value[R"(x_y_z)"] = R"({0}{0} {0} {0}{0}{0})";

    test.IsEqual(Template::Render(R"({svar:x_y_z, {var:ffffff}})", value, ss), R"(gg g ggg)", __LINE__);
    ss.Clear();

    value[R"(x_y_z)"] = R"({0},{1}.{2}-{3}**{4}////{5}=={6} {7} {8} {9})";

    test.IsEqual(
        Template::Render(
            R"({svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}})",
            value, ss),
        R"(g,a.e-8000000000007779999999**10////true==ccc dddd bb f)", __LINE__);
    ss.Clear();

    value[R"(a)"] = R"('a)";
    value[R"(b)"] = R"(<>bb)";

    value[R"(x_y_z)"] = R"({0},{1}.{2}-{3}**{4}////{5}=={6} {7} {8} {9})";

    if (Config::AutoEscapeHTML) {
        test.IsEqual(
            Template::Render(
                R"({svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}})",
                value, ss),
            R"(g,&apos;a.e-8000000000007779999999**10////true==ccc dddd &lt;&gt;bb f)", __LINE__);
    } else {
        test.IsEqual(
            Template::Render(
                R"({svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}})",
                value, ss),
            R"(g,'a.e-8000000000007779999999**10////true==ccc dddd <>bb f)", __LINE__);
    }

    ss.Clear();

    test.IsEqual(
        Template::Render(
            R"({svar:x_y_z, {raw:ffffff}, {raw:a}, {raw:4}, {raw:999999999}, {raw:g}, {raw:h}, {raw:c}, {raw:d}, {raw:b}, {raw:e}})",
            value, ss),
        R"(g,'a.e-8000000000007779999999**10////true==ccc dddd <>bb f)", __LINE__);
    ss.Clear();

    value[R"(a)"] = 10;
    value[R"(b)"] = 5;
    value[R"(c)"] = 3;

    value[R"(x_y_z)"] = R"({0} {1} {2} {3} {4})";

    test.IsEqual(Template::Render(R"({svar:x_y_z, {math:{var:a}+{var:b}+{var:c}},
    {math:{var:a}*{var:b}*{var:c}},
    {math:{var:a}-{var:b}-{var:c}},
    {math:{var:a}+{var:b}-{var:c}},
    {math:{var:a}/{var:b}+{var:c}}})",
                                  value, ss),
                 R"(18 150 2 12 5)", __LINE__);
}